

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyStateTransitionDesc
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,StateTransitionDesc *Barrier)

{
  RenderDeviceVkImpl *pDevice;
  DeviceContextIndex ExecutionCtxId;
  bool bVar1;
  string msg;
  string local_38;
  
  pDevice = (this->m_pDevice).m_pObject;
  ExecutionCtxId = GetExecutionCtxId(this);
  bVar1 = VerifyStateTransitionDesc((IRenderDevice *)pDevice,Barrier,ExecutionCtxId,&this->m_Desc);
  if (!bVar1) {
    FormatString<char[32]>(&local_38,(char (*) [32])"StateTransitionDesc are invalid");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"DvpVerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa42);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifyStateTransitionDesc(const StateTransitionDesc& Barrier) const
{
    DEV_CHECK_ERR(VerifyStateTransitionDesc(m_pDevice, Barrier, GetExecutionCtxId(), this->m_Desc), "StateTransitionDesc are invalid");
}